

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O0

void exportJSON(FILE *out,long rows,long columns,double *counts,bool do_prot)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  byte in_R8B;
  long c;
  bool first;
  long r;
  bool do_comma;
  char local_41;
  long local_40;
  long local_30;
  
  fprintf(in_RDI,"{");
  if (in_RCX != 0) {
    bVar2 = false;
    for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
      bVar1 = true;
      for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
        if (0.0 < *(double *)(in_RCX + (local_30 * in_RDX + local_40) * 8)) {
          if (bVar1) {
            local_41 = ',';
            if (!bVar2) {
              local_41 = ' ';
            }
            cVar3 = unmap_char((uchar)local_40,(bool)(in_R8B & 1));
            fprintf(in_RDI,"%c\n\t\"%ld\" : {\"%c\" : %g",
                    *(undefined8 *)(in_RCX + (local_30 * in_RDX + local_40) * 8),
                    (ulong)(uint)(int)local_41,local_30 + 1,(ulong)(uint)(int)cVar3);
            bVar2 = true;
            bVar1 = false;
          }
          else {
            cVar3 = unmap_char((uchar)local_40,(bool)(in_R8B & 1));
            fprintf(in_RDI,", \"%c\" : %g",
                    *(undefined8 *)(in_RCX + (local_30 * in_RDX + local_40) * 8),
                    (ulong)(uint)(int)cVar3);
          }
        }
      }
      if (!bVar1) {
        fprintf(in_RDI,"}");
      }
    }
  }
  fprintf(in_RDI,"\n}\n");
  return;
}

Assistant:

void exportJSON (FILE* out, long rows, long columns, const double* counts, bool do_prot) {
  fprintf (out, "{");
  
  if (counts) {
    bool do_comma = false;
    for (long r = 0; r < rows; r++) {
      bool first = true;
      for (long c = 0; c < columns; c++) {
        if (counts [r*columns + c] > 0.0) {
          if (first) {
            fprintf (out, "%c\n\t\"%ld\" : {\"%c\" : %g", do_comma ? ',' : ' ', r + 1, unmap_char(c,do_prot), counts[r*columns+c]);
            do_comma = true;
            first = false;
          } else {
            fprintf (out, ", \"%c\" : %g", unmap_char(c,do_prot) , counts[r*columns+c]);
          }
        }
      }
      if (!first) {
        fprintf (out, "}");
      }
    }
  }
  
  fprintf (out, "\n}\n");
}